

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O3

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::LoopInvariantCodeMotionCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopInvariantCodeMotionCase *this,bool optimized)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  int iVar4;
  ulong *puVar5;
  long *plVar6;
  size_type *psVar7;
  ulong *unaff_RBP;
  ulong uVar8;
  ulong *unaff_R12;
  ulong *unaff_R13;
  long *unaff_R15;
  string precision;
  string statements;
  long *local_350;
  undefined8 local_348;
  long local_340;
  undefined8 uStack_338;
  ulong *local_330;
  long local_328;
  ulong local_320;
  long lStack_318;
  float local_30c;
  ulong *local_308;
  undefined8 local_300;
  ulong local_2f8;
  undefined8 uStack_2f0;
  long *local_2e8;
  undefined8 local_2e0;
  long local_2d8;
  undefined8 uStack_2d0;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8 [2];
  ulong *local_2a8;
  long local_2a0;
  ulong local_298 [2];
  ulong *local_288;
  long local_280;
  ulong local_278;
  long lStack_270;
  ulong *local_268;
  long local_260;
  ulong local_258;
  long lStack_250;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_30c = 0.0;
  if (0 < this->m_numLoopIterations) {
    iVar4 = 0;
    do {
      local_30c = local_30c + (float)iVar4 * 3.2 + 4.6;
      iVar4 = iVar4 + 1;
    } while (this->m_numLoopIterations != iVar4);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  if (CASESHADERTYPE_FRAGMENT < (this->super_ShaderOptimizationCase).m_caseShaderType) {
    uVar3 = std::__throw_logic_error("basic_string::_M_construct null not valid");
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_2c8 != local_2b8) {
      operator_delete(local_2c8,local_2b8[0] + 1);
    }
    if (local_330 != unaff_R13) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_208 != unaff_R15) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
    if (local_268 != unaff_R12) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_288 != unaff_RBP) {
      operator_delete(local_288,local_278 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT26(local_228.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_228.field_2._M_local_buf[5],
                                        CONCAT14(local_228.field_2._M_local_buf[4],
                                                 local_228.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    _Unwind_Resume(uVar3);
  }
  local_30c = 1.0 / local_30c;
  local_228.field_2._M_local_buf[4] = 'p';
  local_228.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_228._M_string_length = 5;
  local_228.field_2._M_local_buf[5] = '\0';
  if (optimized) {
    std::operator+(&local_1c8,"\t",&local_228);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_1c8);
    local_288 = &local_278;
    puVar5 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar5) {
      local_278 = *puVar5;
      lStack_270 = plVar1[3];
    }
    else {
      local_278 = *puVar5;
      local_288 = (ulong *)*plVar1;
    }
    local_280 = plVar1[1];
    *plVar1 = (long)puVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_228._M_dataplus._M_p);
    local_308 = &local_2f8;
    puVar5 = puVar2 + 2;
    if ((ulong *)*puVar2 == puVar5) {
      local_2f8 = *puVar5;
      uStack_2f0 = puVar2[3];
    }
    else {
      local_2f8 = *puVar5;
      local_308 = (ulong *)*puVar2;
    }
    local_300 = puVar2[1];
    *puVar2 = puVar5;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_308);
    puVar5 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar5) {
      local_258 = *puVar5;
      lStack_250 = plVar1[3];
      local_268 = &local_258;
    }
    else {
      local_258 = *puVar5;
      local_268 = (ulong *)*plVar1;
    }
    local_260 = plVar1[1];
    *plVar1 = (long)puVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,this->m_numLoopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_268 != &local_258) {
      uVar8 = local_258;
    }
    if (uVar8 < (ulong)(local_2a0 + local_260)) {
      uVar8 = 0xf;
      if (local_2a8 != local_298) {
        uVar8 = local_298[0];
      }
      if (uVar8 < (ulong)(local_2a0 + local_260)) goto LAB_012c7459;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_268);
    }
    else {
LAB_012c7459:
      puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_2a8);
    }
    local_2e8 = &local_2d8;
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_2d8 = *plVar1;
      uStack_2d0 = puVar2[3];
    }
    else {
      local_2d8 = *plVar1;
      local_2e8 = (long *)*puVar2;
    }
    local_2e0 = puVar2[1];
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)plVar1 = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_248 = &local_238;
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_238 = *plVar6;
      lStack_230 = plVar1[3];
    }
    else {
      local_238 = *plVar6;
      local_248 = (long *)*plVar1;
    }
    local_240 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_248,(ulong)local_228._M_dataplus._M_p);
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_1f8 = *plVar6;
      lStack_1f0 = plVar1[3];
      local_208 = &local_1f8;
    }
    else {
      local_1f8 = *plVar6;
      local_208 = (long *)*plVar1;
    }
    local_200 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar5 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar5) {
      local_320 = *puVar5;
      lStack_318 = plVar1[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar5;
      local_330 = (ulong *)*plVar1;
    }
    local_328 = plVar1[1];
    *plVar1 = (long)puVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>((double)local_30c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_330 != &local_320) {
      uVar8 = local_320;
    }
    if (uVar8 < (ulong)(local_2c0 + local_328)) {
      uVar8 = 0xf;
      if (local_2c8 != local_2b8) {
        uVar8 = local_2b8[0];
      }
      if (uVar8 < (ulong)(local_2c0 + local_328)) goto LAB_012c79a4;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_012c79a4:
      puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2c8);
    }
    local_350 = &local_340;
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_340 = *plVar1;
      uStack_338 = puVar2[3];
    }
    else {
      local_340 = *plVar1;
      local_350 = (long *)*puVar2;
    }
    local_348 = puVar2[1];
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)plVar1 = 0;
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_350);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar7 = puVar2 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1e8.field_2._M_allocated_capacity = *psVar7;
      local_1e8.field_2._8_8_ = puVar2[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar7;
      local_1e8._M_dataplus._M_p = (pointer)*puVar2;
    }
    local_1e8._M_string_length = puVar2[1];
    *puVar2 = psVar7;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_2c8 != local_2b8) {
      operator_delete(local_2c8,local_2b8[0] + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_2a8 != local_298) {
      operator_delete(local_2a8,local_298[0] + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    local_298[0] = local_2f8;
    local_2a8 = local_308;
    if (local_308 == &local_2f8) goto LAB_012c7d58;
  }
  else {
    std::operator+(&local_1c8,"\t",&local_228);
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c8);
    puVar5 = puVar2 + 2;
    if ((ulong *)*puVar2 == puVar5) {
      local_278 = *puVar5;
      lStack_270 = puVar2[3];
      local_288 = &local_278;
    }
    else {
      local_278 = *puVar5;
      local_288 = (ulong *)*puVar2;
    }
    local_280 = puVar2[1];
    *puVar2 = puVar5;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,this->m_numLoopIterations);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_288 != &local_278) {
      uVar8 = local_278;
    }
    if (uVar8 < (ulong)(local_2a0 + local_280)) {
      uVar8 = 0xf;
      if (local_2a8 != local_298) {
        uVar8 = local_298[0];
      }
      if (uVar8 < (ulong)(local_2a0 + local_280)) goto LAB_012c7310;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_288);
    }
    else {
LAB_012c7310:
      puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_288,(ulong)local_2a8);
    }
    local_308 = &local_2f8;
    puVar5 = puVar2 + 2;
    if ((ulong *)*puVar2 == puVar5) {
      local_2f8 = *puVar5;
      uStack_2f0 = puVar2[3];
    }
    else {
      local_2f8 = *puVar5;
      local_308 = (ulong *)*puVar2;
    }
    local_300 = puVar2[1];
    *puVar2 = puVar5;
    puVar2[1] = 0;
    *(undefined1 *)puVar5 = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_308);
    puVar5 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar5) {
      local_258 = *puVar5;
      lStack_250 = plVar1[3];
      local_268 = &local_258;
    }
    else {
      local_258 = *puVar5;
      local_268 = (ulong *)*plVar1;
    }
    local_260 = plVar1[1];
    *plVar1 = (long)puVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    puVar2 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_228._M_dataplus._M_p);
    local_2e8 = &local_2d8;
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_2d8 = *plVar1;
      uStack_2d0 = puVar2[3];
    }
    else {
      local_2d8 = *plVar1;
      local_2e8 = (long *)*puVar2;
    }
    local_2e0 = puVar2[1];
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_248 = &local_238;
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_238 = *plVar6;
      lStack_230 = plVar1[3];
    }
    else {
      local_238 = *plVar6;
      local_248 = (long *)*plVar1;
    }
    local_240 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_248,(ulong)local_228._M_dataplus._M_p);
    plVar6 = plVar1 + 2;
    if ((long *)*plVar1 == plVar6) {
      local_1f8 = *plVar6;
      lStack_1f0 = plVar1[3];
      local_208 = &local_1f8;
    }
    else {
      local_1f8 = *plVar6;
      local_208 = (long *)*plVar1;
    }
    local_200 = plVar1[1];
    *plVar1 = (long)plVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_208);
    puVar5 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar5) {
      local_320 = *puVar5;
      lStack_318 = plVar1[3];
      local_330 = &local_320;
    }
    else {
      local_320 = *puVar5;
      local_330 = (ulong *)*plVar1;
    }
    local_328 = plVar1[1];
    *plVar1 = (long)puVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<double>((double)local_30c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar8 = 0xf;
    if (local_330 != &local_320) {
      uVar8 = local_320;
    }
    if (uVar8 < (ulong)(local_2c0 + local_328)) {
      uVar8 = 0xf;
      if (local_2c8 != local_2b8) {
        uVar8 = local_2b8[0];
      }
      if (uVar8 < (ulong)(local_2c0 + local_328)) goto LAB_012c7760;
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2c8,0,(char *)0x0,(ulong)local_330);
    }
    else {
LAB_012c7760:
      puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_330,(ulong)local_2c8);
    }
    local_350 = &local_340;
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_340 = *plVar1;
      uStack_338 = puVar2[3];
    }
    else {
      local_340 = *plVar1;
      local_350 = (long *)*puVar2;
    }
    local_348 = puVar2[1];
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)plVar1 = 0;
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_350);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar7 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1e8.field_2._M_allocated_capacity = *psVar7;
      local_1e8.field_2._8_8_ = plVar1[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar7;
      local_1e8._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_1e8._M_string_length = plVar1[1];
    *plVar1 = (long)psVar7;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_350 != &local_340) {
      operator_delete(local_350,local_340 + 1);
    }
    if (local_2c8 != local_2b8) {
      operator_delete(local_2c8,local_2b8[0] + 1);
    }
    if (local_330 != &local_320) {
      operator_delete(local_330,local_320 + 1);
    }
    if (local_208 != &local_1f8) {
      operator_delete(local_208,local_1f8 + 1);
    }
    if (local_248 != &local_238) {
      operator_delete(local_248,local_238 + 1);
    }
    if (local_2e8 != &local_2d8) {
      operator_delete(local_2e8,local_2d8 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_308 != &local_2f8) {
      operator_delete(local_308,local_2f8 + 1);
    }
    if (local_2a8 == local_298) goto LAB_012c7d58;
  }
  operator_delete(local_2a8,local_298[0] + 1);
LAB_012c7d58:
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  local_1a8[0]._M_string_length = 0;
  local_1a8[0].field_2._M_local_buf[0] = '\0';
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  defaultProgramData(__return_storage_ptr__,(this->super_ShaderOptimizationCase).m_caseShaderType,
                     local_1a8,&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,
                    CONCAT71(local_1a8[0].field_2._M_allocated_capacity._1_7_,
                             local_1a8[0].field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,
                    CONCAT26(local_228.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_228.field_2._M_local_buf[5],
                                      CONCAT14(local_228.field_2._M_local_buf[4],
                                               local_228.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		float scale = 0.0f;
		for (int i = 0; i < m_numLoopIterations; i++)
			scale += 3.2f*(float)i + 4.6f;
		scale = 1.0f / scale;

		const string precision		= getShaderPrecision(m_caseShaderType);
		const string statements		= optimized ?	"	" + precision + " vec4 valueOrig = value;\n"
													"	" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n"

												:	"	" + precision + " vec4 valueOrig = value;\n"
													"	for (int i = 0; i < " + toString(m_numLoopIterations) + "; i++)\n"
													"	{\n"
													"		" + precision + " float x = 3.2*float(i) + 4.6;\n"
													"		" + precision + " vec4 y = sin(cos(sin(valueOrig)));\n"
													"		value += x*y;\n"
													"	}\n"
													"	value *= " + toString(scale) + ";\n";

		return defaultProgramData(m_caseShaderType, statements);
	}